

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2.c
# Opt level: O0

MPP_RET check_super_frame(RcModelV2Ctx *ctx,EncRcTaskInfo *cfg)

{
  EncFrmType EVar1;
  RcCfg *usr_cfg;
  RK_U32 bits_thr;
  RK_S32 frame_type;
  MPP_RET ret;
  EncRcTaskInfo *cfg_local;
  RcModelV2Ctx *ctx_local;
  
  bits_thr = 0;
  EVar1 = cfg->frame_type;
  if ((rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","enter %p\n","check_super_frame",ctx);
  }
  if ((ctx->usr_cfg).super_cfg.super_mode != MPP_ENC_RC_SUPER_FRM_NONE) {
    usr_cfg._4_4_ = (ctx->usr_cfg).super_cfg.super_p_thd;
    if (EVar1 == INTRA_FRAME) {
      usr_cfg._4_4_ = (ctx->usr_cfg).super_cfg.super_i_thd;
    }
    if (usr_cfg._4_4_ <= (uint)cfg->bit_real) {
      if ((ctx->usr_cfg).super_cfg.super_mode == MPP_ENC_RC_SUPER_FRM_DROP) {
        if ((rc_debug & 0x40) != 0) {
          _mpp_log_l(4,"rc_model_v2","super frame drop current frame","check_super_frame");
        }
        (ctx->usr_cfg).drop_mode = MPP_ENC_RC_DROP_FRM_NORMAL;
        (ctx->usr_cfg).drop_gap = 0;
      }
      bits_thr = 0xffffffff;
    }
  }
  if ((rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","leave %p\n","check_super_frame",ctx);
  }
  return bits_thr;
}

Assistant:

MPP_RET check_super_frame(RcModelV2Ctx *ctx, EncRcTaskInfo *cfg)
{
    MPP_RET ret = MPP_OK;
    RK_S32 frame_type = cfg->frame_type;
    RK_U32 bits_thr = 0;
    RcCfg *usr_cfg = &ctx->usr_cfg;

    rc_dbg_func("enter %p\n", ctx);
    if (usr_cfg->super_cfg.super_mode) {
        bits_thr = usr_cfg->super_cfg.super_p_thd;
        if (frame_type == INTRA_FRAME) {
            bits_thr = usr_cfg->super_cfg.super_i_thd;
        }

        if ((RK_U32)cfg->bit_real >= bits_thr) {
            if (usr_cfg->super_cfg.super_mode == MPP_ENC_RC_SUPER_FRM_DROP) {
                rc_dbg_rc("super frame drop current frame");
                usr_cfg->drop_mode = MPP_ENC_RC_DROP_FRM_NORMAL;
                usr_cfg->drop_gap  = 0;
            }
            ret = MPP_NOK;
        }
    }
    rc_dbg_func("leave %p\n", ctx);
    return ret;
}